

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse::InternalSwap
          (CodeGeneratorResponse *this,CodeGeneratorResponse *other)

{
  uint32 uVar1;
  int iVar2;
  string *psVar3;
  void *pvVar4;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar5;
  void *pvVar6;
  UnknownFieldSet *pUVar7;
  UnknownFieldSet *pUVar8;
  
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->file_).super_RepeatedPtrFieldBase,&(other->file_).super_RepeatedPtrFieldBase);
  psVar3 = (this->error_).ptr_;
  (this->error_).ptr_ = (other->error_).ptr_;
  (other->error_).ptr_ = psVar3;
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  pvVar6 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  pvVar4 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar6 & 1) == 0) {
    if (((ulong)pvVar4 & 1) == 0) goto LAB_0023dc37;
LAB_0023dc1f:
    pUVar8 = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar4 & 1) != 0) goto LAB_0023dc1f;
    pUVar8 = internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(other->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
    pvVar6 = (this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_;
  }
  if (((ulong)pvVar6 & 1) == 0) {
    pUVar7 = internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
  }
  else {
    pUVar7 = (UnknownFieldSet *)((ulong)pvVar6 & 0xfffffffffffffffe);
  }
  pvVar5 = pUVar7->fields_;
  pUVar7->fields_ = pUVar8->fields_;
  pUVar8->fields_ = pvVar5;
LAB_0023dc37:
  iVar2 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar2;
  return;
}

Assistant:

void CodeGeneratorResponse::InternalSwap(CodeGeneratorResponse* other) {
  file_.InternalSwap(&other->file_);
  error_.Swap(&other->error_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}